

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ZSTD_compressionParameters *cParams;
  BYTE *iEnd;
  BYTE *iStart;
  int *piVar1;
  uint uVar2;
  uint uVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  U32 *pUVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  U32 UVar12;
  BYTE *pBVar13;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  BYTE *pBVar18;
  uint uVar19;
  BYTE *pBVar20;
  BYTE *pBVar21;
  int *ip;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  int *piVar25;
  bool bVar26;
  uint local_11c;
  uint local_cc;
  int *local_c8;
  int local_9c;
  
  iEnd = (BYTE *)((long)src + srcSize);
  piVar1 = (int *)((long)src + (srcSize - 8));
  pBVar4 = (ms->window).base;
  pBVar5 = (ms->window).dictBase;
  uVar2 = (ms->window).dictLimit;
  uVar3 = (ms->window).lowLimit;
  iStart = pBVar4 + uVar2;
  pBVar13 = pBVar5 + uVar2;
  local_11c = *rep;
  local_cc = rep[1];
  ms->nextToUpdate3 = ms->nextToUpdate;
  ip = (int *)((ulong)(iStart == (BYTE *)src) + (long)src);
  iVar8 = uVar2 - 1;
  cParams = &ms->cParams;
LAB_003bf97e:
  do {
    if (piVar1 <= ip) {
      *rep = local_11c;
      rep[1] = local_cc;
      return (long)iEnd - (long)src;
    }
    iVar22 = (int)ip;
    local_9c = iVar22 - (int)pBVar4;
    uVar9 = (local_9c - local_11c) + 1;
    pBVar18 = pBVar4;
    if (uVar9 < uVar2) {
      pBVar18 = pBVar5;
    }
    if ((uVar3 < uVar9 && 2 < iVar8 - uVar9) &&
       (*(int *)((long)ip + 1) == *(int *)(pBVar18 + uVar9))) {
      pBVar20 = iEnd;
      if (uVar9 < uVar2) {
        pBVar20 = pBVar13;
      }
      sVar14 = ZSTD_count_2segments
                         ((BYTE *)((long)ip + 5),(BYTE *)((long)(pBVar18 + uVar9) + 4),iEnd,pBVar20,
                          iStart);
      uVar15 = sVar14 + 4;
    }
    else {
      uVar15 = 0;
    }
    uVar9 = (ms->cParams).minMatch;
    if (uVar9 - 6 < 2) {
      pUVar6 = ms->chainTable;
      uVar10 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
      pBVar18 = (ms->window).base;
      pBVar20 = (ms->window).dictBase;
      uVar9 = (ms->window).dictLimit;
      uVar19 = (ms->window).lowLimit;
      uVar23 = iVar22 - (int)pBVar18;
      uVar7 = uVar23 - uVar10;
      if (uVar23 < uVar10) {
        uVar7 = 0;
      }
      iVar22 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
      uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,6);
      uVar24 = 999999999;
      uVar17 = 3;
      while( true ) {
        bVar26 = iVar22 == 0;
        iVar22 = iVar22 + -1;
        if ((uVar11 <= uVar19) || (bVar26)) break;
        if (uVar11 < uVar9) {
          if (*(int *)(pBVar20 + uVar11) == *ip) {
            sVar14 = ZSTD_count_2segments
                               ((BYTE *)(ip + 1),pBVar20 + (ulong)uVar11 + 4,iEnd,pBVar20 + uVar9,
                                pBVar18 + uVar9);
            uVar16 = sVar14 + 4;
LAB_003bfb59:
            if ((uVar17 < uVar16) &&
               (uVar24 = (ulong)((uVar23 + 2) - uVar11), uVar17 = uVar16,
               (BYTE *)((long)ip + uVar16) == iEnd)) break;
          }
        }
        else if ((pBVar18 + uVar11)[uVar17] == *(BYTE *)((long)ip + uVar17)) {
          uVar16 = ZSTD_count((BYTE *)ip,pBVar18 + uVar11,iEnd);
          goto LAB_003bfb59;
        }
        if (uVar11 <= uVar7) break;
        uVar11 = pUVar6[uVar11 & uVar10 - 1];
      }
    }
    else if (uVar9 == 5) {
      pUVar6 = ms->chainTable;
      uVar10 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
      pBVar18 = (ms->window).base;
      pBVar20 = (ms->window).dictBase;
      uVar9 = (ms->window).dictLimit;
      uVar19 = (ms->window).lowLimit;
      uVar23 = iVar22 - (int)pBVar18;
      uVar7 = uVar23 - uVar10;
      if (uVar23 < uVar10) {
        uVar7 = 0;
      }
      iVar22 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
      uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,5);
      uVar24 = 999999999;
      uVar17 = 3;
      while( true ) {
        bVar26 = iVar22 == 0;
        iVar22 = iVar22 + -1;
        if ((uVar11 <= uVar19) || (bVar26)) break;
        if (uVar11 < uVar9) {
          if (*(int *)(pBVar20 + uVar11) == *ip) {
            sVar14 = ZSTD_count_2segments
                               ((BYTE *)(ip + 1),pBVar20 + (ulong)uVar11 + 4,iEnd,pBVar20 + uVar9,
                                pBVar18 + uVar9);
            uVar16 = sVar14 + 4;
LAB_003bfcb4:
            if ((uVar17 < uVar16) &&
               (uVar24 = (ulong)((uVar23 + 2) - uVar11), uVar17 = uVar16,
               (BYTE *)((long)ip + uVar16) == iEnd)) break;
          }
        }
        else if ((pBVar18 + uVar11)[uVar17] == *(BYTE *)((long)ip + uVar17)) {
          uVar16 = ZSTD_count((BYTE *)ip,pBVar18 + uVar11,iEnd);
          goto LAB_003bfcb4;
        }
        if (uVar11 <= uVar7) break;
        uVar11 = pUVar6[uVar11 & uVar10 - 1];
      }
    }
    else {
      pUVar6 = ms->chainTable;
      uVar10 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
      pBVar18 = (ms->window).base;
      pBVar20 = (ms->window).dictBase;
      uVar9 = (ms->window).dictLimit;
      uVar19 = (ms->window).lowLimit;
      uVar23 = iVar22 - (int)pBVar18;
      uVar7 = uVar23 - uVar10;
      if (uVar23 < uVar10) {
        uVar7 = 0;
      }
      iVar22 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
      uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,4);
      uVar24 = 999999999;
      uVar17 = 3;
      while( true ) {
        bVar26 = iVar22 == 0;
        iVar22 = iVar22 + -1;
        if ((uVar11 <= uVar19) || (bVar26)) break;
        if (uVar11 < uVar9) {
          if (*(int *)(pBVar20 + uVar11) == *ip) {
            sVar14 = ZSTD_count_2segments
                               ((BYTE *)(ip + 1),pBVar20 + (ulong)uVar11 + 4,iEnd,pBVar20 + uVar9,
                                pBVar18 + uVar9);
            uVar16 = sVar14 + 4;
LAB_003bfe0f:
            if ((uVar17 < uVar16) &&
               (uVar24 = (ulong)((uVar23 + 2) - uVar11), uVar17 = uVar16,
               (BYTE *)((long)ip + uVar16) == iEnd)) break;
          }
        }
        else if ((pBVar18 + uVar11)[uVar17] == *(BYTE *)((long)ip + uVar17)) {
          uVar16 = ZSTD_count((BYTE *)ip,pBVar18 + uVar11,iEnd);
          goto LAB_003bfe0f;
        }
        if (uVar11 <= uVar7) break;
        uVar11 = pUVar6[uVar11 & uVar10 - 1];
      }
    }
    uVar16 = uVar15;
    if (uVar15 < uVar17) {
      uVar16 = uVar17;
    }
    if (uVar16 < 4) {
      ip = (int *)((long)ip + ((long)ip - (long)src >> 8) + 1);
      goto LAB_003bf97e;
    }
    piVar25 = ip;
    if (uVar17 <= uVar15) {
      uVar24 = 0;
      piVar25 = (int *)((long)ip + 1);
    }
    do {
      uVar17 = uVar24;
      uVar15 = uVar16;
      local_c8 = piVar25;
      if (piVar1 <= ip) break;
      piVar25 = (int *)((long)ip + 1);
      local_9c = local_9c + 1;
      if (uVar17 == 0) {
        uVar17 = 0;
      }
      else {
        uVar9 = local_9c - local_11c;
        pBVar18 = pBVar4;
        if (uVar9 < uVar2) {
          pBVar18 = pBVar5;
        }
        if ((uVar3 < uVar9 && 2 < iVar8 - uVar9) && (*piVar25 == *(int *)(pBVar18 + uVar9))) {
          pBVar20 = iEnd;
          if (uVar9 < uVar2) {
            pBVar20 = pBVar13;
          }
          sVar14 = ZSTD_count_2segments
                             ((BYTE *)((long)ip + 5),(BYTE *)((long)(pBVar18 + uVar9) + 4),iEnd,
                              pBVar20,iStart);
          if (sVar14 < 0xfffffffffffffffc) {
            uVar19 = (int)uVar17 + 1;
            uVar9 = 0x1f;
            if (uVar19 != 0) {
              for (; uVar19 >> uVar9 == 0; uVar9 = uVar9 - 1) {
              }
            }
            if ((int)((uVar9 ^ 0x1f) + (int)uVar15 * 3 + -0x1e) < (int)(sVar14 + 4) * 3) {
              uVar17 = 0;
              uVar15 = sVar14 + 4;
              local_c8 = piVar25;
            }
          }
        }
      }
      uVar9 = (ms->cParams).minMatch;
      iVar22 = (int)piVar25;
      if (uVar9 - 6 < 2) {
        pUVar6 = ms->chainTable;
        uVar10 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pBVar18 = (ms->window).base;
        pBVar20 = (ms->window).dictBase;
        uVar9 = (ms->window).dictLimit;
        uVar19 = (ms->window).lowLimit;
        uVar23 = iVar22 - (int)pBVar18;
        uVar7 = uVar23 - uVar10;
        if (uVar23 < uVar10) {
          uVar7 = 0;
        }
        iVar22 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        UVar12 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)piVar25,6);
        uVar24 = 999999999;
        uVar16 = 3;
        while( true ) {
          bVar26 = iVar22 == 0;
          iVar22 = iVar22 + -1;
          if ((UVar12 <= uVar19) || (bVar26)) break;
          if (UVar12 < uVar9) {
            if (*(int *)(pBVar20 + UVar12) == *piVar25) {
              sVar14 = ZSTD_count_2segments
                                 ((BYTE *)((long)ip + 5),pBVar20 + (ulong)UVar12 + 4,iEnd,
                                  pBVar20 + uVar9,pBVar18 + uVar9);
              sVar14 = sVar14 + 4;
LAB_003c00cc:
              if ((uVar16 < sVar14) &&
                 (uVar24 = (ulong)((uVar23 + 2) - UVar12), uVar16 = sVar14,
                 (BYTE *)((long)piVar25 + sVar14) == iEnd)) break;
            }
          }
          else if ((pBVar18 + UVar12)[uVar16] == *(BYTE *)((long)piVar25 + uVar16)) {
            sVar14 = ZSTD_count((BYTE *)piVar25,pBVar18 + UVar12,iEnd);
            goto LAB_003c00cc;
          }
          if (UVar12 <= uVar7) break;
          UVar12 = pUVar6[UVar12 & uVar10 - 1];
        }
      }
      else if (uVar9 == 5) {
        pUVar6 = ms->chainTable;
        uVar10 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pBVar18 = (ms->window).base;
        pBVar20 = (ms->window).dictBase;
        uVar9 = (ms->window).dictLimit;
        uVar19 = (ms->window).lowLimit;
        uVar23 = iVar22 - (int)pBVar18;
        uVar7 = uVar23 - uVar10;
        if (uVar23 < uVar10) {
          uVar7 = 0;
        }
        iVar22 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        UVar12 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)piVar25,5);
        uVar24 = 999999999;
        uVar16 = 3;
        while( true ) {
          bVar26 = iVar22 == 0;
          iVar22 = iVar22 + -1;
          if ((UVar12 <= uVar19) || (bVar26)) break;
          if (UVar12 < uVar9) {
            if (*(int *)(pBVar20 + UVar12) == *piVar25) {
              sVar14 = ZSTD_count_2segments
                                 ((BYTE *)((long)ip + 5),pBVar20 + (ulong)UVar12 + 4,iEnd,
                                  pBVar20 + uVar9,pBVar18 + uVar9);
              sVar14 = sVar14 + 4;
LAB_003c0232:
              if ((uVar16 < sVar14) &&
                 (uVar24 = (ulong)((uVar23 + 2) - UVar12), uVar16 = sVar14,
                 (BYTE *)((long)piVar25 + sVar14) == iEnd)) break;
            }
          }
          else if ((pBVar18 + UVar12)[uVar16] == *(BYTE *)((long)piVar25 + uVar16)) {
            sVar14 = ZSTD_count((BYTE *)piVar25,pBVar18 + UVar12,iEnd);
            goto LAB_003c0232;
          }
          if (UVar12 <= uVar7) break;
          UVar12 = pUVar6[UVar12 & uVar10 - 1];
        }
      }
      else {
        pUVar6 = ms->chainTable;
        uVar10 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pBVar18 = (ms->window).base;
        pBVar20 = (ms->window).dictBase;
        uVar9 = (ms->window).dictLimit;
        uVar19 = (ms->window).lowLimit;
        uVar23 = iVar22 - (int)pBVar18;
        uVar7 = uVar23 - uVar10;
        if (uVar23 < uVar10) {
          uVar7 = 0;
        }
        iVar22 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        UVar12 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)piVar25,4);
        uVar24 = 999999999;
        uVar16 = 3;
        while( true ) {
          bVar26 = iVar22 == 0;
          iVar22 = iVar22 + -1;
          if ((UVar12 <= uVar19) || (bVar26)) break;
          if (UVar12 < uVar9) {
            if (*(int *)(pBVar20 + UVar12) == *piVar25) {
              sVar14 = ZSTD_count_2segments
                                 ((BYTE *)((long)ip + 5),pBVar20 + (ulong)UVar12 + 4,iEnd,
                                  pBVar20 + uVar9,pBVar18 + uVar9);
              sVar14 = sVar14 + 4;
LAB_003c038f:
              if ((uVar16 < sVar14) &&
                 (uVar24 = (ulong)((uVar23 + 2) - UVar12), uVar16 = sVar14,
                 (BYTE *)((long)piVar25 + sVar14) == iEnd)) break;
            }
          }
          else if ((pBVar18 + UVar12)[uVar16] == *(BYTE *)((long)piVar25 + uVar16)) {
            sVar14 = ZSTD_count((BYTE *)piVar25,pBVar18 + UVar12,iEnd);
            goto LAB_003c038f;
          }
          if (UVar12 <= uVar7) break;
          UVar12 = pUVar6[UVar12 & uVar10 - 1];
        }
      }
      if (uVar16 < 4) break;
      uVar19 = (int)uVar17 + 1;
      uVar9 = 0x1f;
      if (uVar19 != 0) {
        for (; uVar19 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar19 = (int)uVar24 + 1;
      iVar22 = 0x1f;
      if (uVar19 != 0) {
        for (; uVar19 >> iVar22 == 0; iVar22 = iVar22 + -1) {
        }
      }
      ip = piVar25;
    } while ((int)((uVar9 ^ 0x1f) + (int)uVar15 * 4 + -0x1b) < (int)uVar16 * 4 - iVar22);
    UVar12 = (U32)uVar17;
    if (uVar17 == 0) {
      UVar12 = 0;
    }
    else {
      pBVar21 = (BYTE *)((long)local_c8 + (-(long)pBVar4 - uVar17) + 2);
      pBVar20 = iStart;
      pBVar18 = pBVar4;
      if ((uint)pBVar21 < uVar2) {
        pBVar20 = pBVar5 + uVar3;
        pBVar18 = pBVar5;
      }
      pBVar18 = pBVar18 + ((ulong)pBVar21 & 0xffffffff);
      for (; ((src < local_c8 && (pBVar20 < pBVar18)) &&
             (*(BYTE *)((long)local_c8 + -1) == pBVar18[-1]));
          local_c8 = (int *)((long)local_c8 + -1)) {
        pBVar18 = pBVar18 + -1;
        uVar15 = uVar15 + 1;
      }
      local_cc = local_11c;
      local_11c = UVar12 - 2;
    }
    ZSTD_storeSeq(seqStore,(long)local_c8 - (long)src,src,UVar12,uVar15 - 3);
    uVar9 = local_cc;
    for (ip = (int *)((long)local_c8 + uVar15); local_cc = uVar9, src = ip, ip <= piVar1;
        ip = (int *)((long)ip + sVar14 + 4)) {
      uVar9 = (uint)((long)ip - (long)(pBVar4 + local_cc));
      pBVar18 = pBVar4;
      if (uVar9 < uVar2) {
        pBVar18 = pBVar5;
      }
      if (((uVar9 <= uVar3) || (iVar8 - uVar9 < 3)) ||
         (*ip != *(int *)(pBVar18 + ((long)ip - (long)(pBVar4 + local_cc) & 0xffffffff)))) break;
      pBVar20 = iEnd;
      if (uVar9 < uVar2) {
        pBVar20 = pBVar13;
      }
      sVar14 = ZSTD_count_2segments
                         ((BYTE *)(ip + 1),
                          (BYTE *)((long)(pBVar18 +
                                         ((long)ip - (long)(pBVar4 + local_cc) & 0xffffffff)) + 4),
                          iEnd,pBVar20,iStart);
      ZSTD_storeSeq(seqStore,0,ip,0,sVar14 + 1);
      uVar9 = local_11c;
      local_11c = local_cc;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, 0, 1);
}